

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O3

bool __thiscall CECorrections::DownloadTable(CECorrections *this,string *filename,string *url)

{
  long lVar1;
  FILE *__stream;
  
  lVar1 = curl_easy_init();
  if (lVar1 != 0) {
    __stream = fopen((filename->_M_dataplus)._M_p,"wb");
    curl_easy_setopt(lVar1,0x2712,(url->_M_dataplus)._M_p);
    curl_easy_setopt(lVar1,0x4e2b,0);
    curl_easy_setopt(lVar1,0x2711,__stream);
    curl_easy_perform(lVar1);
    curl_easy_cleanup(lVar1);
    fclose(__stream);
  }
  return true;
}

Assistant:

bool CECorrections::DownloadTable(const std::string& filename,
                                  const std::string& url) const
{
    bool success = true;
    #ifndef NOCURL
    try {
        CURL *curl;
        FILE *fp;
        CURLcode res;
        curl = curl_easy_init();                                                                                                                                                                                                                                                           
        if (curl)
        {   
            fp = fopen(filename.c_str(), "wb");
            curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
            curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, NULL);
            curl_easy_setopt(curl, CURLOPT_WRITEDATA, fp);
            res = curl_easy_perform(curl);
            curl_easy_cleanup(curl);
            fclose(fp);
            // TODO: handle the result
        }   
    } 
    // Catch exceptions that may happen
    catch (std::exception& e) {
        std::cerr << "ERROR trying to download corrections files: " 
                  << e.what() << std::endl;
        success = false;
    }
    #else
    std::cout << "CppEphem was not compiled with curl support. To download "
              << "the corrections file automatically, recompile with -DNOCURL=0."
              << std::endl;
    success = false;
    #endif

    return success;
}